

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

string * __thiscall
lan::db::write_array_bit_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bit *bits)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  db_bit *bit;
  string local_50;
  
  bit = bits->lin;
  sVar1 = (bits->key)._M_string_length;
  if (sVar1 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (bits->key)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)&local_50);
  }
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bit != (db_bit *)0x0) {
    while( true ) {
      write_bit_abi_cxx11_(&local_50,this,bit,true);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bit = bit->nex;
      if (bit == (db_bit *)0x0) break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_array_bit(db_bit * bits){
            db_bit * buffer = bits->lin;
            std::string bits_str = ((bits->key.length()) ? bits->key + "=" : "") + "a:[";
            while(buffer){
                bits_str += write_bit(buffer, true);
                buffer = buffer->nex;
                if(buffer)bits_str += (' ');
            } bits_str += "]";
            return bits_str;
        }